

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  key_type **pppcVar1;
  ulong uVar2;
  PyTypeObject *pPVar3;
  handle *handle;
  uint __val;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  detail *this;
  char *pcVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  pointer *ppcVar12;
  ulong uVar13;
  ulong *puVar14;
  PyObject *pPVar15;
  handle *handle_00;
  handle *handle_01;
  string *in_RDI;
  pointer pcVar16;
  undefined8 uVar17;
  uint __len;
  undefined8 local_1a8;
  undefined8 local_1a0;
  PyObject *local_198;
  size_type local_190;
  PyObject local_188;
  string *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  undefined1 local_148 [8];
  error_scope scope;
  PyObject local_120;
  size_type *local_110;
  string __str;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  pointer *local_b0;
  long local_a8;
  pointer local_a0;
  long lStack_98;
  accessor<pybind11::detail::accessor_policies::str_attr> local_90;
  _Alloc_hider local_70;
  size_type __dnew;
  undefined8 local_60;
  undefined8 uStack_58;
  handle local_50;
  size_type local_48;
  PyObject local_40;
  
  lVar7 = PyErr_Occurred();
  if (lVar7 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_70._M_p = (pointer)0x1f;
    pcVar8 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)in_RDI,(ulong)&stack0xffffffffffffff90);
    (in_RDI->_M_dataplus)._M_p = pcVar8;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_70._M_p;
    builtin_strncpy(pcVar8,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_70._M_p;
    local_70._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(local_148,&scope,&scope.value);
    local_170 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_170;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_178 = in_RDI;
    if (local_148 != (undefined1  [8])0x0) {
      local_90.obj.m_ptr = (PyObject *)local_148;
      local_90.key = "__name__";
      local_90.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      this = (detail *)accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_90)
      ;
      load_type<std::__cxx11::string>
                ((make_caster<std::__cxx11::basic_string<char>_> *)&stack0xffffffffffffff90,this,
                 handle_00);
      local_50.m_ptr = (PyObject *)local_70._M_p;
      if ((PyObject *)local_70._M_p == (PyObject *)&stack0xffffffffffffffa0) {
        local_40.ob_type = (PyTypeObject *)uStack_58;
        local_50.m_ptr = &local_40;
      }
      local_40.ob_refcnt = local_60;
      local_48 = __dnew;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_50.m_ptr);
      if (local_50.m_ptr != &local_40) {
        operator_delete(local_50.m_ptr,local_40.ob_refcnt + 1);
      }
      object::~object(&local_90.cache);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (scope.type != (PyObject *)0x0) {
      local_50.m_ptr = (PyObject *)PyObject_Str();
      str::operator_cast_to_string((string *)&stack0xffffffffffffff90,(str *)&local_50);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_70._M_p);
      if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
        operator_delete(local_70._M_p,local_60 + 1);
      }
      object::~object((object *)&local_50);
    }
    PyErr_NormalizeException(local_148,&scope,&scope.value);
    if ((scope.value != (PyObject *)0x0) &&
       (PyException_SetTraceback(scope.type), scope.value != (PyObject *)0x0)) {
      do {
        pPVar15 = scope.value;
        scope.value = (PyObject *)pPVar15[1].ob_refcnt;
      } while (scope.value != (PyObject *)0x0);
      pPVar3 = pPVar15[1].ob_type;
      std::__cxx11::string::append((char *)in_RDI);
      for (; pPVar3 != (PyTypeObject *)0x0; pPVar3 = (PyTypeObject *)pPVar3->tp_name) {
        uVar5 = PyFrame_GetLineNumber(pPVar3);
        local_1a8 = *(undefined8 *)(pPVar3->tp_basicsize + 0x68);
        load_type<std::__cxx11::string>
                  ((make_caster<std::__cxx11::basic_string<char>_> *)&stack0xffffffffffffff90,
                   (detail *)&local_1a8,handle_01);
        if ((PyObject *)local_70._M_p == (PyObject *)&stack0xffffffffffffffa0) {
          local_188.ob_type = (PyTypeObject *)uStack_58;
          local_198 = &local_188;
        }
        else {
          local_198 = (PyObject *)local_70._M_p;
        }
        local_188.ob_refcnt = local_60;
        local_190 = __dnew;
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x118d4e);
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_158 = *plVar11;
          lStack_150 = plVar9[3];
          local_168 = &local_158;
        }
        else {
          local_158 = *plVar11;
          local_168 = (long *)*plVar9;
        }
        local_160 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_168);
        ppcVar12 = (pointer *)(plVar9 + 2);
        if ((pointer *)*plVar9 == ppcVar12) {
          local_a0 = *ppcVar12;
          lStack_98 = plVar9[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *ppcVar12;
          local_b0 = (pointer *)*plVar9;
        }
        local_a8 = plVar9[1];
        *plVar9 = (long)ppcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        __val = -uVar5;
        if (0 < (int)uVar5) {
          __val = uVar5;
        }
        __len = 1;
        if (9 < __val) {
          uVar13 = (ulong)__val;
          uVar4 = 4;
          do {
            __len = uVar4;
            uVar6 = (uint)uVar13;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_00108b78;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_00108b78;
            }
            if (uVar6 < 10000) goto LAB_00108b78;
            uVar13 = uVar13 / 10000;
            uVar4 = __len + 4;
          } while (99999 < uVar6);
          __len = __len + 1;
        }
LAB_00108b78:
        local_110 = &__str._M_string_length;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_110,(char)__len - (char)((int)uVar5 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_110),__len,__val);
        in_RDI = local_178;
        pcVar16 = (pointer)0xf;
        if (local_b0 != &local_a0) {
          pcVar16 = local_a0;
        }
        if (pcVar16 < __str._M_dataplus._M_p + local_a8) {
          pcVar16 = (pointer)0xf;
          if (local_110 != &__str._M_string_length) {
            pcVar16 = (pointer)__str._M_string_length;
          }
          if (pcVar16 < __str._M_dataplus._M_p + local_a8) goto LAB_00108c1c;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_b0);
        }
        else {
LAB_00108c1c:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_110);
        }
        local_d0 = &local_c0;
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_c0 = *plVar9;
          uStack_b8 = puVar10[3];
        }
        else {
          local_c0 = *plVar9;
          local_d0 = (long *)*puVar10;
        }
        local_c8 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)plVar9 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
        __str.field_2._8_8_ = &local_e0;
        puVar14 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar14) {
          local_e0 = *puVar14;
          lStack_d8 = plVar9[3];
        }
        else {
          local_e0 = *puVar14;
          __str.field_2._8_8_ = (ulong *)*plVar9;
        }
        handle = (handle *)plVar9[1];
        *plVar9 = (long)puVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        local_1a0 = *(undefined8 *)(pPVar3->tp_basicsize + 0x70);
        load_type<std::__cxx11::string>
                  ((make_caster<std::__cxx11::basic_string<char>_> *)&stack0xffffffffffffff90,
                   (detail *)&local_1a0,handle);
        scope.trace = (PyObject *)local_70._M_p;
        if ((PyObject *)local_70._M_p == (PyObject *)&stack0xffffffffffffffa0) {
          local_120.ob_type = (PyTypeObject *)uStack_58;
          scope.trace = &local_120;
        }
        local_120.ob_refcnt = local_60;
        uVar13 = 0xf;
        if ((ulong *)__str.field_2._8_8_ != &local_e0) {
          uVar13 = local_e0;
        }
        uVar2 = (long)&handle->m_ptr + __dnew;
        if (uVar13 < uVar2) {
          uVar17 = 0xf;
          if (scope.trace != &local_120) {
            uVar17 = local_60;
          }
          if ((ulong)uVar17 < uVar2) goto LAB_00108d9d;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&scope.trace,0,(char *)0x0,__str.field_2._8_8_);
        }
        else {
LAB_00108d9d:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              (__str.field_2._M_local_buf + 8,(ulong)scope.trace);
        }
        local_90._0_8_ = &local_90.key;
        pppcVar1 = (key_type **)(puVar10 + 2);
        if ((key_type **)*puVar10 == pppcVar1) {
          local_90.key = (key_type)*pppcVar1;
          local_90.cache.super_handle.m_ptr = (handle)puVar10[3];
        }
        else {
          local_90.key = (key_type)*pppcVar1;
          local_90._0_8_ = (key_type **)*puVar10;
        }
        local_90.obj.m_ptr = (PyObject *)puVar10[1];
        *puVar10 = pppcVar1;
        puVar10[1] = 0;
        *(undefined1 *)pppcVar1 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_50.m_ptr = &local_40;
        pPVar15 = (PyObject *)(plVar9 + 2);
        if ((PyObject *)*plVar9 == pPVar15) {
          local_40.ob_refcnt = pPVar15->ob_refcnt;
          local_40.ob_type = (PyTypeObject *)plVar9[3];
        }
        else {
          local_40.ob_refcnt = pPVar15->ob_refcnt;
          local_50.m_ptr = (PyObject *)*plVar9;
        }
        local_48 = plVar9[1];
        *plVar9 = (long)pPVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_50.m_ptr);
        if (local_50.m_ptr != &local_40) {
          operator_delete(local_50.m_ptr,local_40.ob_refcnt + 1);
        }
        if ((key_type *)local_90._0_8_ != &local_90.key) {
          operator_delete((void *)local_90._0_8_,(long)local_90.key + 1);
        }
        if (scope.trace != &local_120) {
          operator_delete(scope.trace,local_120.ob_refcnt + 1);
        }
        if ((ulong *)__str.field_2._8_8_ != &local_e0) {
          operator_delete((void *)__str.field_2._8_8_,local_e0 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_110 != &__str._M_string_length) {
          operator_delete(local_110,__str._M_string_length + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,(ulong)(local_a0 + 1));
        }
        if (local_168 != &local_158) {
          operator_delete(local_168,local_158 + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188.ob_refcnt + 1);
        }
      }
    }
    error_scope::~error_scope((error_scope *)local_148);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}